

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RangeSink::RangeSink
          (RangeSink *this,InputFile *file,Options *options,DataSource data_source,
          DualMap *translator,Arena *arena)

{
  undefined4 in_ECX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Options *in_stack_00000098;
  Options *in_stack_000000a0;
  
  *in_RDI = in_RSI;
  Options::Options(in_stack_000000a0,in_stack_00000098);
  *(undefined4 *)(in_RDI + 0x1d) = in_ECX;
  in_RDI[0x1e] = in_R8;
  std::
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  ::vector((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
            *)0x191406);
  in_RDI[0x22] = in_R9;
  return;
}

Assistant:

RangeSink::RangeSink(const InputFile* file, const Options& options,
                     DataSource data_source, const DualMap* translator,
                     google::protobuf::Arena* arena)
    : file_(file),
      options_(options),
      data_source_(data_source),
      translator_(translator),
      arena_(arena) {}